

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O2

void __thiscall Polymer::CheckBehind(Polymer *this,int old_start,int new_start)

{
  element_type *peVar1;
  pointer pIVar2;
  bool bVar3;
  int iVar4;
  Interval<std::shared_ptr<ReleaseSite>,_unsigned_long> *interval;
  SpeciesTracker *this_00;
  pointer pIVar5;
  BindingSite *this_01;
  pointer pIVar6;
  allocator local_79;
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  term_results;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  results;
  
  results.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  results.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  results.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findOverlapping
            (&this->binding_sites_,(long)old_start,(long)(new_start + 1),&results);
  pIVar2 = results.
           super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pIVar6 = results.
                super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pIVar6 != pIVar2; pIVar6 = pIVar6 + 1) {
    this_01 = (pIVar6->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((this_01->super_FixedElement).stop_ < new_start) {
      iVar4 = (this_01->super_FixedElement).covered_;
      if (0 < iVar4) {
        iVar4 = iVar4 + -1;
        (this_01->super_FixedElement).covered_ = iVar4;
      }
      if (iVar4 == 0 && 0 < (this_01->super_FixedElement).old_covered_) {
        std::__cxx11::string::string((string *)&term_results,"__ribosome",&local_79);
        BindingSite::CheckInteraction(this_01,(string *)&term_results);
        std::__cxx11::string::~string((string *)&term_results);
        LogUncover(this,&(((pIVar6->value).
                           super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         super_FixedElement).name_);
        this_01 = (pIVar6->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        if ((this_01->super_FixedElement).first_exposure_ == false) {
          std::__cxx11::string::string((string *)&term_results,"__ribosome",&local_79);
          bVar3 = BindingSite::CheckInteraction(this_01,(string *)&term_results);
          std::__cxx11::string::~string((string *)&term_results);
          if (bVar3) {
            this_00 = SpeciesTracker::Instance();
            SpeciesTracker::IncrementTranscript
                      (this_00,&(((pIVar6->value).
                                  super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                 )->super_FixedElement).gene_,1);
            this_01 = (pIVar6->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            (this_01->super_FixedElement).first_exposure_ = true;
            this->total_elements_ = this->total_elements_ + 1;
          }
          else {
            this_01 = (pIVar6->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
          }
        }
      }
      (this_01->super_FixedElement).old_covered_ = (this_01->super_FixedElement).covered_;
    }
  }
  term_results.
  super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  term_results.
  super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  term_results.
  super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::findOverlapping
            (&this->release_sites_,(long)old_start,(long)(new_start + 1),&term_results);
  for (pIVar5 = term_results.
                super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pIVar5 != term_results.
                super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pIVar5 = pIVar5 + 1) {
    peVar1 = (pIVar5->value).super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1->super_FixedElement).stop_ < new_start) {
      iVar4 = (peVar1->super_FixedElement).covered_;
      if (0 < iVar4) {
        iVar4 = iVar4 + -1;
        (peVar1->super_FixedElement).covered_ = iVar4;
      }
      if (iVar4 == 0 && 0 < (peVar1->super_FixedElement).old_covered_) {
        (peVar1->super_FixedElement).field_0x9d = 0;
      }
      (peVar1->super_FixedElement).old_covered_ = iVar4;
    }
  }
  std::
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ::~vector(&term_results);
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~vector(&results);
  return;
}

Assistant:

void Polymer::CheckBehind(int old_start, int new_start) {
  std::vector<Interval<BindingSite::Ptr>> results;
  binding_sites_.findOverlapping(old_start, new_start + 1, results);
  for (auto &interval : results) {
    // std::cout << interval.value->name() + " " +
    //                  std::to_string(interval.value->start()) +
    //                  std::to_string(interval.value->stop()) + " " +
    //                  std::to_string(new_start)
    //           << std::endl;
    if (interval.value->stop() < new_start) {
      // std::cout << interval.value->name() << std::endl;
      interval.value->Uncover();
      if (interval.value->WasUncovered()) {
        if (interval.value->CheckInteraction("__ribosome")) {
          // std::cout << "RBS uncovered!" << std::endl;
        }
        // Record changes that species was covered
        LogUncover(interval.value->name());
        // Is this a new transcript?
        if (!interval.value->first_exposure() &&
            interval.value->CheckInteraction("__ribosome")) {
          SpeciesTracker::Instance().IncrementTranscript(interval.value->gene(),
                                                         1);
          interval.value->first_exposure(true);
          total_elements_ += 1;
        }
      }
      interval.value->ResetState();
    }
  }

  std::vector<Interval<ReleaseSite::Ptr>> term_results;
  release_sites_.findOverlapping(old_start, new_start + 1, term_results);
  for (auto &interval : term_results) {
    if (interval.value->stop() < new_start) {
      interval.value->Uncover();
      // if (interval.value->name() != "stop_codon") {
      //   std::cout << "Terminator uncovered!" + interval.value->name()
      //             << std::endl;
      //   std::cout << interval.value->IsCovered() << std::endl;
      // }
      if (interval.value->WasUncovered()) {
        // Record changes that species was covered
        // LogUncover(interval.value->name());
        // Is this a terminator being uncovered?
        // if (interval.value->name() != "stop_codon") {
        //   std::cout << "Readthrough set to false!" << std::endl;
        // }
        interval.value->readthrough(false);
      }
      interval.value->ResetState();
    }
  }
}